

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ellipsoid.cpp
# Opt level: O3

HydroProp * __thiscall OpenMD::Ellipsoid::getHydroProp(Ellipsoid *this,RealType viscosity)

{
  double dVar1;
  pointer pcVar2;
  double dVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  double *pdVar9;
  HydroProp *this_00;
  long lVar10;
  uint i;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  long *local_298 [2];
  long local_288 [2];
  Vector3d local_278;
  double local_258;
  double adStack_250 [13];
  double local_1e8;
  double local_1b0;
  double local_178;
  double local_140;
  Mat6x6d local_138;
  
  dVar16 = this->rAxial_;
  dVar1 = this->rEquatorial_;
  dVar12 = dVar16 * dVar16;
  dVar3 = dVar1 * dVar1;
  if (dVar16 / dVar1 <= 1.0) {
    dVar14 = dVar3 - dVar12;
    dVar15 = SQRT(dVar14);
    dVar1 = dVar15;
    if (dVar14 < 0.0) {
      dVar1 = sqrt(dVar14);
    }
    if (dVar14 < 0.0) {
      dVar15 = sqrt(dVar14);
    }
    dVar15 = atan(dVar15 / dVar16);
    dVar15 = (2.0 / dVar1) * dVar15;
  }
  else {
    dVar13 = dVar12 - dVar3;
    dVar15 = SQRT(dVar13);
    dVar14 = dVar15;
    if (dVar13 < 0.0) {
      dVar14 = sqrt(dVar13);
    }
    if (dVar13 < 0.0) {
      dVar15 = sqrt(dVar13);
    }
    dVar15 = log((dVar15 + dVar16) / dVar1);
    dVar15 = (2.0 / dVar14) * dVar15;
  }
  dVar14 = dVar12 - dVar3;
  dVar16 = dVar16 + dVar16;
  dVar1 = ((dVar12 + dVar12) - dVar3) * dVar15 - dVar16;
  dVar13 = (viscosity * 100.53096491487338 * dVar14) /
           ((dVar3 * -3.0 + dVar12 + dVar12) * dVar15 + dVar16);
  dVar12 = ((dVar12 * dVar12 - dVar3 * dVar3) * viscosity * 33.510321638291124) / dVar1;
  lVar11 = 0;
  memset(adStack_250,0,0x110);
  local_258 = dVar13;
  adStack_250[6] = dVar13;
  local_1e8 = (viscosity * 50.26548245743669 * dVar14) / dVar1;
  local_1b0 = dVar12;
  local_178 = dVar12;
  local_140 = (dVar14 * viscosity * 33.510321638291124 * dVar3) / (dVar16 - dVar15 * dVar3);
  pdVar9 = &local_258;
  do {
    lVar10 = 0;
    do {
      dVar16 = (pdVar9 + lVar10)[1];
      pdVar9[lVar10] = pdVar9[lVar10] * 14393.26479;
      (pdVar9 + lVar10)[1] = dVar16 * 14393.26479;
      lVar10 = lVar10 + 2;
    } while (lVar10 != 6);
    lVar11 = lVar11 + 1;
    pdVar9 = pdVar9 + 6;
  } while (lVar11 != 6);
  this_00 = (HydroProp *)operator_new(0x280);
  local_278.super_Vector<double,_3U>.data_[0] = (double)OpenMD::V3Zero._0_8_;
  local_278.super_Vector<double,_3U>.data_[1] = (double)OpenMD::V3Zero._8_8_;
  local_278.super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
  lVar11 = 0;
  do {
    uVar4 = *(undefined8 *)((long)&local_258 + lVar11);
    uVar5 = *(undefined8 *)((long)adStack_250 + lVar11);
    uVar6 = *(undefined8 *)((long)adStack_250 + lVar11 + 8U);
    uVar7 = *(undefined8 *)((long)adStack_250 + lVar11 + 0x10U);
    uVar8 = *(undefined8 *)((long)adStack_250 + lVar11 + 0x20U);
    *(undefined8 *)((long)local_138.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar11 + 0x20) =
         *(undefined8 *)((long)adStack_250 + lVar11 + 0x18U);
    *(undefined8 *)((long)local_138.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar11 + 0x28) =
         uVar8;
    *(undefined8 *)((long)local_138.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar11 + 0x10) =
         uVar6;
    *(undefined8 *)((long)local_138.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar11 + 0x18) =
         uVar7;
    *(undefined8 *)((long)local_138.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar11) = uVar4;
    *(undefined8 *)((long)local_138.super_RectMatrix<double,_6U,_6U>.data_[0] + lVar11 + 8) = uVar5;
    lVar11 = lVar11 + 0x30;
  } while (lVar11 != 0x120);
  HydroProp::HydroProp(this_00,&local_278,&local_138);
  pcVar2 = (this->super_Shape).name_._M_dataplus._M_p;
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_298,pcVar2,pcVar2 + (this->super_Shape).name_._M_string_length);
  std::__cxx11::string::_M_assign((string *)this_00);
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  return this_00;
}

Assistant:

HydroProp* Ellipsoid::getHydroProp(RealType viscosity) {
    RealType a  = rAxial_;
    RealType b  = rEquatorial_;
    RealType a2 = a * a;
    RealType b2 = b * b;

    RealType p = a / b;
    RealType S;
    if (p > 1.0) {
      // Ellipsoid is prolate:
      S = 2.0 / sqrt(a2 - b2) * log((a + sqrt(a2 - b2)) / b);
    } else {
      // Ellipsoid is oblate:
      S = 2.0 / sqrt(b2 - a2) * atan(sqrt(b2 - a2) / a);
    }

    RealType pi = Constants::PI;
    RealType XittA =
        16.0 * pi * viscosity * (a2 - b2) / ((2.0 * a2 - b2) * S - 2.0 * a);
    RealType XittB = 32.0 * pi * viscosity * (a2 - b2) /
                     ((2.0 * a2 - 3.0 * b2) * S + 2.0 * a);
    RealType XirrA =
        32.0 / 3.0 * pi * viscosity * (a2 - b2) * b2 / (2.0 * a - b2 * S);
    RealType XirrB = 32.0 / 3.0 * pi * viscosity * (a2 * a2 - b2 * b2) /
                     ((2.0 * a2 - b2) * S - 2.0 * a);

    Mat6x6d Xi;

    Xi(0, 0) = XittB;
    Xi(1, 1) = XittB;
    Xi(2, 2) = XittA;
    Xi(3, 3) = XirrB;
    Xi(4, 4) = XirrB;
    Xi(5, 5) = XirrA;

    Xi *= Constants::viscoConvert;

    HydroProp* hprop = new HydroProp(V3Zero, Xi);
    hprop->setName(getName());

    return hprop;
  }